

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void FindStates(lemon *lemp)

{
  char *key;
  symbol *psVar1;
  config *pcVar2;
  long lVar3;
  rule *prVar4;
  
  current = (config *)0x0;
  currentend = &current;
  basis = (config *)0x0;
  basisend = &basis;
  Configtable_init();
  key = lemp->start;
  if (key != (char *)0x0) {
    psVar1 = Symbol_find(key);
    if (psVar1 != (symbol *)0x0) goto LAB_00104128;
    ErrorMsg(lemp->filename,0,
             "The specified start symbol \"%s\" is not in a nonterminal of the grammar.  \"%s\" will be used as the start symbol instead."
             ,key,lemp->startRule->lhs->name);
    lemp->errorcnt = lemp->errorcnt + 1;
  }
  psVar1 = lemp->startRule->lhs;
LAB_00104128:
  for (prVar4 = lemp->rule; prVar4 != (rule *)0x0; prVar4 = prVar4->next) {
    if (0 < prVar4->nrhs) {
      lVar3 = 0;
      do {
        if (prVar4->rhs[lVar3] == psVar1) {
          ErrorMsg(lemp->filename,0,
                   "The start symbol \"%s\" occurs on the right-hand side of a rule. This will result in a parser which does not work properly."
                   ,psVar1->name);
          lemp->errorcnt = lemp->errorcnt + 1;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < prVar4->nrhs);
    }
  }
  prVar4 = psVar1->rule;
  while( true ) {
    if (prVar4 == (rule *)0x0) {
      getstate(lemp);
      return;
    }
    prVar4->lhsStart = 1;
    pcVar2 = Configlist_addbasis(prVar4,0);
    if (size < 1) break;
    *pcVar2->fws = '\x01';
    prVar4 = prVar4->nextlhs;
  }
  __assert_fail("e>=0 && e<size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                ,0x1299,"int SetAdd(char *, int)");
}

Assistant:

void FindStates(struct lemon *lemp)
{
  struct symbol *sp;
  struct rule *rp;

  Configlist_init();

  /* Find the start symbol */
  if( lemp->start ){
    sp = Symbol_find(lemp->start);
    if( sp==0 ){
      ErrorMsg(lemp->filename,0,
"The specified start symbol \"%s\" is not \
in a nonterminal of the grammar.  \"%s\" will be used as the start \
symbol instead.",lemp->start,lemp->startRule->lhs->name);
      lemp->errorcnt++;
      sp = lemp->startRule->lhs;
    }
  }else{
    sp = lemp->startRule->lhs;
  }

  /* Make sure the start symbol doesn't occur on the right-hand side of
  ** any rule.  Report an error if it does.  (YACC would generate a new
  ** start symbol in this case.) */
  for(rp=lemp->rule; rp; rp=rp->next){
    int i;
    for(i=0; i<rp->nrhs; i++){
      if( rp->rhs[i]==sp ){   /* FIX ME:  Deal with multiterminals */
        ErrorMsg(lemp->filename,0,
"The start symbol \"%s\" occurs on the \
right-hand side of a rule. This will result in a parser which \
does not work properly.",sp->name);
        lemp->errorcnt++;
      }
    }
  }

  /* The basis configuration set for the first state
  ** is all rules which have the start symbol as their
  ** left-hand side */
  for(rp=sp->rule; rp; rp=rp->nextlhs){
    struct config *newcfp;
    rp->lhsStart = 1;
    newcfp = Configlist_addbasis(rp,0);
    SetAdd(newcfp->fws,0);
  }

  /* Compute the first state.  All other states will be
  ** computed automatically during the computation of the first one.
  ** The returned pointer to the first state is not used. */
  (void)getstate(lemp);
  return;
}